

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O0

void __thiscall OpenMD::Mie::Mie(Mie *this)

{
  undefined8 *in_RDI;
  VanDerWaalsInteraction *in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  VanDerWaalsInteraction::VanDerWaalsInteraction(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__Mie_00524270;
  *(undefined1 *)(in_RDI + 1) = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x30e008);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x30e01b);
  std::
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  ::vector((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
            *)0x30e02e);
  in_RDI[0xe] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x30e049);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  return;
}

Assistant:

Mie::Mie() : initialized_(false), forceField_(NULL), name_("Mie") {}